

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OrderMoney.h
# Opt level: O3

void __thiscall
OrderMoney::OrderMoney<std::shared_ptr<RealMoney>,std::shared_ptr<RealMoney>>
          (OrderMoney *this,string *currency,shared_ptr<const_Bank> *bank,
          shared_ptr<RealMoney> *money,shared_ptr<RealMoney> *money_1)

{
  undefined1 local_79;
  ExchangedMoney *local_78;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_70;
  shared_ptr<const_Money> local_68;
  ExchangedMoney *local_58;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_50;
  shared_ptr<const_Money> local_48;
  
  local_58 = (ExchangedMoney *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<ExchangedMoney,std::allocator<ExchangedMoney>,std::shared_ptr<RealMoney>const&,std::shared_ptr<Bank_const>const&,std::__cxx11::string_const&>
            (&_Stack_50,&local_58,(allocator<ExchangedMoney> *)&local_68,money,bank,currency);
  local_48.super___shared_ptr<const_Money,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &local_58->super_Money;
  local_48.super___shared_ptr<const_Money,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Stack_50._M_pi;
  local_58 = (ExchangedMoney *)0x0;
  _Stack_50._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_78 = (ExchangedMoney *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<ExchangedMoney,std::allocator<ExchangedMoney>,std::shared_ptr<RealMoney>const&,std::shared_ptr<Bank_const>const&,std::__cxx11::string_const&>
            (&_Stack_70,&local_78,(allocator<ExchangedMoney> *)&local_79,money_1,bank,currency);
  local_68.super___shared_ptr<const_Money,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &local_78->super_Money;
  local_68.super___shared_ptr<const_Money,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Stack_70._M_pi;
  local_78 = (ExchangedMoney *)0x0;
  _Stack_70._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  OrderMoney(this,&local_48,&local_68);
  if (local_68.super___shared_ptr<const_Money,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_68.super___shared_ptr<const_Money,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (_Stack_70._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_70._M_pi);
  }
  if (local_48.super___shared_ptr<const_Money,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_48.super___shared_ptr<const_Money,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (_Stack_50._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_50._M_pi);
  }
  return;
}

Assistant:

OrderMoney(
		const std::string &currency,
		const std::shared_ptr<const Bank> &bank,
		const T & ... money
	) : OrderMoney(std::make_shared<ExchangedMoney>(money, bank, currency)...)
	{
	}